

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<unsigned_int>
          (Attribute *this,double t,uint *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type_conflict3 *pvVar2;
  optional<unsigned_int> local_48;
  optional<unsigned_int> local_40;
  optional<unsigned_int> v;
  TimeSampleInterpolationType tinterp_local;
  uint *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (uint *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<unsigned_int>(&local_48,&this->_var);
      nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>(&local_40,&local_48);
      nonstd::optional_lite::optional<unsigned_int>::~optional(&local_48);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<unsigned_int>::value(&local_40);
        *dst = *pvVar2;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<unsigned_int>::~optional(&local_40);
      if (bVar1) goto LAB_007b1783;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<unsigned_int>(&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<unsigned_int>(this,dst);
    }
  }
LAB_007b1783:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }